

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTUINTDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  void *in_RDI;
  size_t in_R8;
  size_t ex;
  size_t l;
  octet *v;
  undefined4 in_stack_ffffffffffffffa8;
  u32 in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar1;
  octet *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  octet **in_stack_ffffffffffffffc8;
  size_t local_8;
  
  local_8 = derDec2(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                    CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else if (((in_stack_ffffffffffffffc0 == (size_t *)0x0) ||
           (((ulong)*in_stack_ffffffffffffffc8 & 0x80) != 0)) ||
          ((*(byte *)in_stack_ffffffffffffffc8 == 0 &&
           (((size_t *)0x1 < in_stack_ffffffffffffffc0 &&
            (((ulong)*in_stack_ffffffffffffffc8 & 0x8000) == 0)))))) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    bVar1 = false;
    if ((*(byte *)in_stack_ffffffffffffffc8 == 0) &&
       (bVar1 = false, (size_t *)0x1 < in_stack_ffffffffffffffc0)) {
      bVar1 = ((ulong)*in_stack_ffffffffffffffc8 & 0x8000) != 0;
    }
    if ((long)in_stack_ffffffffffffffc0 - (long)(int)(uint)(bVar1 != false) == in_R8) {
      if (in_RDI != (void *)0x0) {
        memMove((void *)CONCAT17(bVar1,in_stack_ffffffffffffffb0),
                (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0x1241b3);
        memRev(in_RDI,in_R8);
      }
    }
    else {
      local_8 = 0xffffffffffffffff;
    }
  }
  return local_8;
}

Assistant:

size_t derTUINTDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	size_t l;
	size_t ex;
	// декодировать
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// в значении менее одного октета?
	// установлен старший бит в первом (старшем) октете?
	// незначащий нулевой октет?
	if (l < 1 || (v[0] & 128) ||
		v[0] == 0 && l > 1 && !(v[1] & 128))
		return SIZE_MAX;
	// дополнительный нулевой октет?
	ex = (v[0] == 0 && l > 1 && (v[1] & 128)) ? 1 : 0;
	// длина не соответствует ожидаемой?
	if (l - ex != len)
		return SIZE_MAX;
	// возвратить значение
	if (val)
	{
		ASSERT(memIsValid(val, len));
		memMove(val, v + ex, len);
		memRev(val, len);
	}
	return count;
}